

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_timeout.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::synchronization_internal::KernelTimeout::KernelTimeout
          (KernelTimeout *this,Duration d)

{
  int64_t iVar1;
  long lVar2;
  long lVar3;
  uint64_t uVar4;
  Duration d_00;
  
  d_00.rep_lo_ = d.rep_lo_;
  uVar4 = 0xffffffffffffffff;
  if (d.rep_hi_ != (HiRep)0x7fffffffffffffff || d_00.rep_lo_ != 0xffffffff) {
    d_00.rep_hi_.hi_ = 0;
    d_00.rep_hi_.lo_ = d_00.rep_lo_;
    iVar1 = ToInt64Nanoseconds((lts_20250127 *)d.rep_hi_,d_00);
    lVar2 = std::chrono::_V2::steady_clock::now();
    if (iVar1 <= 0x7fffffffffffffff - lVar2) {
      lVar3 = 0;
      if (0 < iVar1) {
        lVar3 = iVar1;
      }
      uVar4 = (lVar3 + lVar2) * 2 + 1;
    }
  }
  this->rep_ = uVar4;
  return;
}

Assistant:

KernelTimeout::KernelTimeout(absl::Duration d) {
  // `absl::InfiniteDuration()` is a common "no timeout" value and cheaper to
  // compare than convert.
  if (d == absl::InfiniteDuration()) {
    rep_ = kNoTimeout;
    return;
  }

  int64_t nanos = absl::ToInt64Nanoseconds(d);

  // Negative durations are normalized to 0.
  // In theory implementations should expire these timeouts immediately.
  if (nanos < 0) {
    nanos = 0;
  }

  int64_t now = SteadyClockNow();
  if (nanos > kMaxNanos - now) {
    // Durations that would be greater than kMaxNanos are converted to infinite.
    rep_ = kNoTimeout;
    return;
  }

  nanos += now;
  rep_ = (static_cast<uint64_t>(nanos) << 1) | uint64_t{1};
}